

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void SetSubMatid(TPZGeoEl *gel,int matid)

{
  int iVar1;
  TPZGeoEl *this;
  int in_ESI;
  long *in_RDI;
  TPZGeoEl *subel;
  int isub;
  int nsub;
  int matid_00;
  
  iVar1 = (**(code **)(*in_RDI + 0x148))();
  for (matid_00 = 0; matid_00 < iVar1; matid_00 = matid_00 + 1) {
    this = (TPZGeoEl *)(**(code **)(*in_RDI + 0x1f8))(in_RDI,matid_00);
    TPZGeoEl::SetMaterialId(this,in_ESI);
    SetSubMatid((TPZGeoEl *)CONCAT44(in_ESI,iVar1),matid_00);
  }
  return;
}

Assistant:

static void SetSubMatid(TPZGeoEl *gel, int matid)
{
    int nsub = gel->NSubElements();
    for (int isub=0; isub < nsub; isub++) {
        TPZGeoEl *subel = gel->SubElement(isub);
        subel->SetMaterialId(matid);
        SetSubMatid(subel, matid);
    }
}